

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_internal.h
# Opt level: O0

mbedtls_ecp_keypair * mbedtls_pk_ec_ro(mbedtls_pk_context pk)

{
  mbedtls_pk_type_t mVar1;
  mbedtls_ecp_keypair *local_10;
  
  mVar1 = mbedtls_pk_get_type((mbedtls_pk_context *)&stack0x00000008);
  if (mVar1 - MBEDTLS_PK_ECKEY < 3) {
    local_10 = (mbedtls_ecp_keypair *)pk.pk_info;
  }
  else {
    local_10 = (mbedtls_ecp_keypair *)0x0;
  }
  return local_10;
}

Assistant:

static inline const mbedtls_ecp_keypair *mbedtls_pk_ec_ro(const mbedtls_pk_context pk)
{
    switch (mbedtls_pk_get_type(&pk)) {
        case MBEDTLS_PK_ECKEY:
        case MBEDTLS_PK_ECKEY_DH:
        case MBEDTLS_PK_ECDSA:
            return (const mbedtls_ecp_keypair *) (pk).MBEDTLS_PRIVATE(pk_ctx);
        default:
            return NULL;
    }
}